

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O1

void __thiscall
t_py_generator::generate_process_function
          (t_py_generator *this,t_service *tservice,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  pointer pcVar2;
  t_struct *ptVar3;
  t_field *ptVar4;
  t_function *ptVar5;
  int iVar6;
  ostream *poVar7;
  bool bVar8;
  t_py_generator *this_00;
  pointer pptVar9;
  string resultname;
  string argsname;
  string local_2c8;
  string local_2a8;
  string local_288;
  t_function *local_268;
  string local_260;
  t_struct *local_240;
  t_py_generator *local_238;
  string local_230;
  string local_210;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  string local_1d0;
  char *local_1b0;
  long local_1a8;
  char local_1a0 [16];
  string local_190;
  char *local_170;
  long local_168;
  char local_160 [16];
  string local_150;
  string local_130;
  char *local_110;
  long local_108;
  char local_100 [16];
  string local_f0;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  os = &this->f_service_;
  if (this->gen_tornado_ == true) {
    t_generator::indent_abi_cxx11_(&local_210,&this->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_210._M_dataplus._M_p,local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"@gen.coroutine",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_230,&this->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"def process_",0xc);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(tfunction->name_)._M_dataplus._M_p,
                        (tfunction->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(self, seqid, iprot, oprot):",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_210,&this->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_210._M_dataplus._M_p,local_210._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"def process_",0xc);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(tfunction->name_)._M_dataplus._M_p,
                        (tfunction->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(self, seqid, iprot, oprot):",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_210);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  pcVar2 = (tfunction->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar2,pcVar2 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_230);
  t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"args = ",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"args.read(iprot)",0x10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_288,&this->super_t_generator);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"iprot.readMessageEnd()",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  local_240 = tfunction->xceptions_;
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result = ",9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
  }
  local_268 = tfunction;
  local_238 = this;
  if (this->gen_twisted_ == true) {
    ptVar3 = tfunction->arglist_;
    t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"d = defer.maybeDeferred(self._handler.",0x26);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(local_268->name_)._M_dataplus._M_p,
                        (local_268->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    pptVar9 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar8 = true;
      do {
        if (bVar8) {
          bVar8 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"args.",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,((*pptVar9)->name_)._M_dataplus._M_p,
                   ((*pptVar9)->name_)._M_string_length);
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,")",1);
    this_00 = local_238;
    ptVar5 = local_268;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (ptVar5->oneway_ == true) {
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"d.addErrback(self.handle_exception_",0x23);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", seqid)",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"d.addCallback(self.write_results_success_",0x29);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", result, seqid, oprot)",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"d.addErrback(self.write_results_exception_",0x2a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", result, seqid, oprot)",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return d",8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    piVar1 = &(this_00->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    if (ptVar5->oneway_ == true) {
      poVar7 = t_generator::indent(&this_00->super_t_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"def handle_exception_",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(self, error, seqid):",0x15);
    }
    else {
      poVar7 = t_generator::indent(&this_00->super_t_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"def write_results_success_",0x1a);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"(self, success, result, seqid, oprot):",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this_00->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      iVar6 = (*(ptVar5->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar6 == '\0') {
        t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.success = success",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageBegin(\"",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\", TMessageType.REPLY, seqid)",0x1d);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.write(oprot)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_288,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageEnd()",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_260,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.trans.flush()",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      piVar1 = &(this_00->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar7 = t_generator::indent(&this_00->super_t_generator,(ostream *)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"def write_results_exception_",0x1c)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"(self, error, result, seqid, oprot):",0x24);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this_00->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    if (ptVar5->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"msg_type = TMessageType.REPLY",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
    }
    t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"try:",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_2a8,this_00);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"error.raiseException()",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((ptVar5->oneway_ == false) &&
       (pptVar9 = (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
       pptVar9 !=
       (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      do {
        ptVar4 = *pptVar9;
        t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except ",7);
        type_name_abi_cxx11_(&local_2a8,this_00,(*pptVar9)->type_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," as ",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(ptVar4->name_)._M_dataplus._M_p,(ptVar4->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
        piVar1 = &(this_00->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.",7);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(ptVar4->name_)._M_dataplus._M_p,(ptVar4->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(ptVar4->name_)._M_dataplus._M_p,(ptVar4->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p);
        }
        piVar1 = &(this_00->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"except TTransport.TTransportException:",0x26);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    ptVar5 = local_268;
    (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"raise",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (ptVar5->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"except TApplicationException as ex:",0x23);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"logging.exception(\'TApplication exception in handler\')",0x36);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_260,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_d0,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_d0,local_c8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"msg_type = TMessageType.EXCEPTION",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_f0,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_110,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_110,local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result = ex",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_130,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except Exception:",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_150,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_170,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_170,local_168);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"logging.exception(\'Unexpected exception in handler\')",0x34);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_190,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_190._M_dataplus._M_p,local_190._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_1b0,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1b0,local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"msg_type = TMessageType.EXCEPTION",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1d0,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_1f0,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1f0,local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                 ,0x56);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_50,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageBegin(\"",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\", msg_type, seqid)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_70,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.write(oprot)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_90,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageEnd()",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_b0,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.trans.flush()",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_00320b72:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (local_1b0 != local_1a0) {
        operator_delete(local_1b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if (local_170 != local_160) {
        operator_delete(local_170);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if (local_110 != local_100) {
        operator_delete(local_110);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
LAB_003212f7:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except Exception:",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"logging.exception(\'Exception in oneway handler\')",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    if (this->gen_tornado_ == true) {
      ptVar3 = tfunction->arglist_;
      if (tfunction->oneway_ == false) {
        poVar7 = t_generator::indent(&this->super_t_generator,(ostream *)os);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"msg_type = TMessageType.REPLY",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"try:",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if ((local_268->oneway_ == false) &&
         (iVar6 = (*(local_268->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar6 == '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"result.success = ",0x11);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,"yield gen.maybe_future(self._handler.",0x25);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,(local_268->name_)._M_dataplus._M_p,
                          (local_268->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
      pptVar9 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      if (pptVar9 !=
          (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar8 = true;
        do {
          if (bVar8) {
            bVar8 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"args.",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)os,((*pptVar9)->name_)._M_dataplus._M_p,
                     ((*pptVar9)->name_)._M_string_length);
          pptVar9 = pptVar9 + 1;
        } while (pptVar9 !=
                 (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"))",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                );
      this_00 = local_238;
      piVar1 = &(local_238->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      if ((local_268->oneway_ == false) &&
         (pptVar9 = (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
         pptVar9 !=
         (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        do {
          ptVar4 = *pptVar9;
          t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except ",7);
          type_name_abi_cxx11_(&local_2a8,this_00,(*pptVar9)->type_);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," as ",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(ptVar4->name_)._M_dataplus._M_p,
                              (ptVar4->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_288,&this_00->super_t_generator);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
          (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_260,this_00);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.",7);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(ptVar4->name_)._M_dataplus._M_p,
                              (ptVar4->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(ptVar4->name_)._M_dataplus._M_p,
                              (ptVar4->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
          pptVar9 = pptVar9 + 1;
        } while (pptVar9 !=
                 (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"except TTransport.TTransportException:",0x26);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      ptVar5 = local_268;
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"raise",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if (ptVar5->oneway_ == false) {
        t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"except TApplicationException as ex:",0x23);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"logging.exception(\'TApplication exception in handler\')",0x36);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_260,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_d0,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"msg_type = TMessageType.EXCEPTION",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_f0,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_110,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_110,local_108);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result = ex",0xb);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_130,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except Exception:",0x11);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_150,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_170,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_170,local_168);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"logging.exception(\'Unexpected exception in handler\')",0x34);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_190,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_190._M_dataplus._M_p,local_190._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_1b0,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1b0,local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"msg_type = TMessageType.EXCEPTION",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1d0,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_1f0,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1f0,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                   ,0x56);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if (local_1b0 != local_1a0) {
          operator_delete(local_1b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if (local_170 != local_160) {
          operator_delete(local_170);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if (local_110 != local_100) {
          operator_delete(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except Exception:",0x11);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"logging.exception(\'Exception in oneway handler\')",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      if (ptVar5->oneway_ != false) goto LAB_00321345;
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageBegin(\"",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\", msg_type, seqid)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.write(oprot)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_288,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageEnd()",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_260,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.trans.flush()",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_003212f7;
    }
    t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"try:",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    ptVar3 = tfunction->arglist_;
    t_generator::indent_abi_cxx11_(&local_2c8,&this->super_t_generator);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if ((local_268->oneway_ == false) &&
       (iVar6 = (*(local_268->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar6 == '\0')) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"result.success = ",0x11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"self._handler.",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,(local_268->name_)._M_dataplus._M_p,
                        (local_268->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
    pptVar9 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar8 = true;
      do {
        if (bVar8) {
          bVar8 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"args.",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,((*pptVar9)->name_)._M_dataplus._M_p,
                   ((*pptVar9)->name_)._M_string_length);
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    this_00 = local_238;
    ptVar5 = local_268;
    if (local_268->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_2c8,&local_238->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"msg_type = TMessageType.REPLY",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
    }
    piVar1 = &(this_00->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"except TTransport.TTransportException:",0x26);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"raise",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (ptVar5->oneway_ == false) {
      pptVar9 = (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pptVar9 !=
          (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          ptVar4 = *pptVar9;
          t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except ",7);
          type_name_abi_cxx11_(&local_2a8,this_00,(*pptVar9)->type_);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," as ",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(ptVar4->name_)._M_dataplus._M_p,
                              (ptVar4->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
          piVar1 = &(this_00->super_t_generator).indent_;
          *piVar1 = *piVar1 + 1;
          t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"msg_type = TMessageType.REPLY",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
          t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.",7);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(ptVar4->name_)._M_dataplus._M_p,
                              (ptVar4->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(ptVar4->name_)._M_dataplus._M_p,
                              (ptVar4->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p);
          }
          piVar1 = &(this_00->super_t_generator).indent_;
          *piVar1 = *piVar1 + -1;
          pptVar9 = pptVar9 + 1;
        } while (pptVar9 !=
                 (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"except TApplicationException as ex:",0x23);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
      ptVar5 = local_268;
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"logging.exception(\'TApplication exception in handler\')",0x36);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_260,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_260._M_dataplus._M_p,local_260._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_d0,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_d0,local_c8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"msg_type = TMessageType.EXCEPTION",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_f0,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_110,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_110,local_108);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result = ex",0xb);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_130,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_130._M_dataplus._M_p,local_130._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except Exception:",0x11);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_150,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_150._M_dataplus._M_p,local_150._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_170,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_170,local_168);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"logging.exception(\'Unexpected exception in handler\')",0x34);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_190,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_190._M_dataplus._M_p,local_190._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_1b0,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1b0,local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"msg_type = TMessageType.EXCEPTION",0x21);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1d0,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_1f0,this_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1f0,local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                 ,0x56);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_50,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageBegin(\"",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(ptVar5->name_)._M_dataplus._M_p,(ptVar5->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\", msg_type, seqid)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_70,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"result.write(oprot)",0x13);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_90,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.writeMessageEnd()",0x17);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_b0,&this_00->super_t_generator);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.trans.flush()",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_00320b72;
    }
    t_generator::indent_abi_cxx11_(&local_2c8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)os,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"except Exception:",0x11);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_2a8,&this_00->super_t_generator);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    (*(this_00->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this_00);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_288._M_dataplus._M_p,local_288._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"logging.exception(\'Exception in oneway handler\')",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
LAB_00321345:
  piVar1 = &(this_00->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_py_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  (void)tservice;
  // Open function
  if (gen_tornado_) {
    f_service_ << indent() << "@gen.coroutine" << endl << indent() << "def process_"
               << tfunction->get_name() << "(self, seqid, iprot, oprot):" << endl;
  } else {
    f_service_ << indent() << "def process_" << tfunction->get_name()
               << "(self, seqid, iprot, oprot):" << endl;
  }

  indent_up();

  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";

  f_service_ << indent() << "args = " << argsname << "()" << endl << indent() << "args.read(iprot)"
             << endl << indent() << "iprot.readMessageEnd()" << endl;

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    f_service_ << indent() << "result = " << resultname << "()" << endl;
  }

  if (gen_twisted_) {
    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    f_service_ << indent() << "d = defer.maybeDeferred(self._handler." << tfunction->get_name()
               << ", ";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << ")" << endl;

    if (tfunction->is_oneway()) {
      f_service_ << indent() << "d.addErrback(self.handle_exception_" << tfunction->get_name()
                 << ", seqid)" << endl;
    } else {
      f_service_ << indent() << "d.addCallback(self.write_results_success_" << tfunction->get_name()
                 << ", result, seqid, oprot)" << endl
                 << indent() << "d.addErrback(self.write_results_exception_"
                 << tfunction->get_name() << ", result, seqid, oprot)" << endl;
    }
    f_service_ << indent() << "return d" << endl << endl;

    indent_down();

    if (tfunction->is_oneway()) {
      indent(f_service_) << "def handle_exception_" << tfunction->get_name()
                         << "(self, error, seqid):" << endl;
    } else {
      indent(f_service_) << "def write_results_success_" << tfunction->get_name()
                         << "(self, success, result, seqid, oprot):" << endl;
      indent_up();
      if (!tfunction->get_returntype()->is_void()) {
        f_service_ << indent() << "result.success = success" << endl;
      }
      f_service_ << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", TMessageType.REPLY, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl
                 << endl;
      indent_down();

      indent(f_service_) << "def write_results_exception_" << tfunction->get_name()
                         << "(self, error, result, seqid, oprot):" << endl;
    }
    indent_up();
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
    }
    f_service_ << indent() << "try:" << endl;

    // Kinda absurd
    f_service_ << indent() << indent_str() << "error.raiseException()" << endl;
    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl;
        indent_up();
        f_service_ << indent() << "result." << xname << " = " << xname << endl;
        indent_down();
      }
    }
    f_service_ << indent() << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl
                 << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Exception in oneway handler')" << endl;
    }
    indent_down();

  } else if (gen_tornado_) {
    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    if (!tfunction->is_oneway()) {
      indent(f_service_) << "msg_type = TMessageType.REPLY" << endl;
    }
    f_service_ << indent() << "try:" << endl;
    indent_up();
    f_service_ << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
      f_service_ << "result.success = ";
    }
    f_service_ << "yield gen.maybe_future(self._handler." << tfunction->get_name() << "(";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << "))" << endl;

    indent_down();
    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl
                   << indent() << indent_str() << "result." << xname << " = " << xname << endl;
      }
    }
    f_service_ << indent() << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Exception in oneway handler')" << endl;
    }

    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    }

    // Close function
    indent_down();

  } else { // py
    // Try block for a function with exceptions
    // It also catches arbitrary exceptions raised by handler method to propagate them to the client
    f_service_ << indent() << "try:" << endl;
    indent_up();

    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    f_service_ << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
      f_service_ << "result.success = ";
    }
    f_service_ << "self._handler." << tfunction->get_name() << "(";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << ")" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
    }

    indent_down();
    f_service_ << indent()
               << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;

    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl;
        indent_up();
        f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
        f_service_ << indent() << "result." << xname << " = " << xname << endl;
        indent_down();
      }

      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl
                 << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str() << "logging.exception('Exception in oneway handler')" << endl;
    }

    // Close function
    indent_down();
  }
}